

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

char * my_stristr(char *string,char *pattern)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte *local_38;
  char *start;
  char *sptr;
  char *pptr;
  char *pattern_local;
  char *string_local;
  
  local_38 = (byte *)string;
  while( true ) {
    if (*local_38 == 0) {
      return (char *)0x0;
    }
    while( true ) {
      bVar3 = false;
      if (*local_38 != 0) {
        iVar1 = toupper((uint)*local_38);
        iVar2 = toupper((uint)(byte)*pattern);
        bVar3 = iVar1 != iVar2;
      }
      if (!bVar3) break;
      local_38 = local_38 + 1;
    }
    if (*local_38 == 0) break;
    start = (char *)local_38;
    sptr = pattern;
    while( true ) {
      iVar1 = toupper((uint)(byte)*start);
      iVar2 = toupper((uint)(byte)*sptr);
      if (iVar1 != iVar2) break;
      start = start + 1;
      sptr = sptr + 1;
      if (*sptr == '\0') {
        return (char *)local_38;
      }
    }
    local_38 = local_38 + 1;
  }
  return (char *)0x0;
}

Assistant:

char *my_stristr(const char *string, const char *pattern)
{
	const char *pptr, *sptr;
	char *start;

	for (start = (char *)string; *start != 0; start++) {
		/* Find start of pattern in string */
		for ( ; ((*start != 0) && (toupper((unsigned char)*start) != toupper((unsigned char)*pattern))); start++)
			;
		if (*start == 0)
			return NULL;

		pptr = (const char *)pattern;
		sptr = (const char *)start;

		while (toupper((unsigned char)*sptr) == toupper((unsigned char)*pptr)) {
			sptr++;
			pptr++;

			/* If end of pattern then pattern was found */
			if (*pptr == 0)
				return (start);
		}
	}

	return NULL;
}